

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O0

void __thiscall
FrobTadsApplicationCurses::scrollRegionUp
          (FrobTadsApplicationCurses *this,int top,int left,int bottom,int right,int attrs)

{
  uint ch;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  int i;
  chtype c;
  chtype c_1;
  int x;
  int y;
  undefined4 local_30;
  chtype in_stack_ffffffffffffffd4;
  chtype in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int y_00;
  
  for (; y_00 = in_EDX, in_ESI < in_ECX; in_ECX = in_ECX + -1) {
    for (; y_00 <= in_R8D; y_00 = y_00 + 1) {
      std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
                ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bbec);
      in_stack_ffffffffffffffd8 =
           FrobTadsWindow::charAt
                     ((FrobTadsWindow *)CONCAT44(in_R9D,in_ECX),y_00,in_stack_ffffffffffffffd8);
      std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
                ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bc13);
      FrobTadsWindow::printChar
                ((FrobTadsWindow *)CONCAT44(in_R9D,in_ECX),y_00,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd4);
    }
    in_stack_ffffffffffffffdc = y_00;
  }
  ch = in_R9D | 0x20;
  for (local_30 = in_EDX; local_30 <= in_R8D; local_30 = local_30 + 1) {
    std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
              ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bc73);
    FrobTadsWindow::printChar
              ((FrobTadsWindow *)CONCAT44(in_R9D,in_ECX),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8,ch);
  }
  if ((*(byte *)(in_RDI + 0xb) & 1) != 0) {
    std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
              ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bcae);
    FrobTadsWindow::flush((FrobTadsWindow *)0x21bcb6);
  }
  return;
}

Assistant:

void
FrobTadsApplicationCurses::scrollRegionUp( int top, int left, int bottom, int right, int attrs )
{
    // Old curses versions might break when using overlapping
    // windows, so we do the scrolling by hand.
    for (int y = bottom; y > top; --y) {
        for (int x = left; x <= right; ++x) {
            const chtype c = this->fGameWindow->charAt(y-1, x);
            this->fGameWindow->printChar(y, x, c);
        }
    }

    // Clear the last line.
    const chtype c = attrs | ' ';
    for (int i = left; i <= right; ++i) this->fGameWindow->printChar(top, i, c);

    // If soft-scrolling is enabled, update the display so that we
    // have a visible scrolling-effect.
    if (this->options.softScroll) this->fGameWindow->flush();
}